

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void __thiscall wasm::WasmBinaryWriter::writeSourceMapUrl(WasmBinaryWriter *this)

{
  char *__s;
  undefined *puVar1;
  int32_t start;
  size_t sVar2;
  string_view name;
  string_view name_00;
  
  start = startSection<wasm::BinaryConsts::Section>(this,Custom);
  puVar1 = BinaryConsts::CustomSections::SourceMapUrl;
  sVar2 = strlen(BinaryConsts::CustomSections::SourceMapUrl);
  name._M_str = puVar1;
  name._M_len = sVar2;
  writeInlineString(this,name);
  __s = (this->sourceMapUrl)._M_dataplus._M_p;
  sVar2 = strlen(__s);
  name_00._M_str = __s;
  name_00._M_len = sVar2;
  writeInlineString(this,name_00);
  finishSection(this,start);
  return;
}

Assistant:

void WasmBinaryWriter::writeSourceMapUrl() {
  auto start = startSection(BinaryConsts::Section::Custom);
  writeInlineString(BinaryConsts::CustomSections::SourceMapUrl);
  writeInlineString(sourceMapUrl.c_str());
  finishSection(start);
}